

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

void __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::SkipList
          (SkipList<unsigned_long,_leveldb::Comparator> *this,Arena *param_2)

{
  Node *pNVar1;
  int i;
  int n;
  unsigned_long local_18;
  
  this->arena_ = param_2;
  local_18 = 0;
  pNVar1 = NewNode(this,&local_18,0xc);
  this->head_ = pNVar1;
  this->max_height_ = (__atomic_base<int>)0x1;
  this->rnd_ = 0x5eadbeef;
  for (n = 0; n != 0xc; n = n + 1) {
    Node::SetNext(this->head_,n,(Node *)0x0);
  }
  return;
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}